

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O2

void __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>::insert
          (IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U> *this,
          unsigned_long left,unsigned_long right,NetAlias **value,allocator_type *alloc)

{
  uint32_t uVar1;
  iterator it;
  const_iterator local_70;
  
  if ((this->height == 0) && (this->rootSize != 8)) {
    local_70.map = (IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U> *)left
    ;
    local_70.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ =
         (pointer)right;
    uVar1 = IntervalMapDetails::
            NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_8U,_true>_>
            ::find((NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_8U,_true>_>
                    *)this,this->rootSize,(interval<unsigned_long> *)&local_70);
    local_70.map = (IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U> *)left
    ;
    local_70.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ =
         (pointer)right;
    uVar1 = IntervalMapDetails::
            LeafNode<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_8U,_true>::insertFrom
                      ((LeafNode<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_8U,_true>
                        *)this,uVar1,this->rootSize,(interval<unsigned_long> *)&local_70,value);
    this->rootSize = uVar1;
  }
  else {
    local_70.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ =
         (pointer)local_70.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                  firstElement;
    local_70.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len = 0;
    local_70.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.cap = 2;
    local_70.map = this;
    const_iterator::setToFind(&local_70,left,right);
    iterator::insert((iterator *)&local_70,left,right,value,alloc);
    SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::cleanup
              ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)&local_70.path,
               (EVP_PKEY_CTX *)left);
  }
  return;
}

Assistant:

void insert(TKey left, TKey right, const TValue& value, allocator_type& alloc) {
        if (isFlat() && rootSize != RootLeaf::Capacity) {
            uint32_t i = rootLeaf.find(rootSize, {left, right});
            rootSize = rootLeaf.insertFrom(i, rootSize, {left, right}, value);
        }
        else {
            iterator it(*this);
            it.setToFind(left, right);
            it.insert(left, right, value, alloc);
        }
    }